

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgemm_tnoe(int m,int n,int k,double alpha,double *a,int lda,double *b,int ldb,double beta,
                  double *c,int ldc,double *d,int ldd)

{
  long lVar1;
  double *pdVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1ac,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (b == (double *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1ad,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (c == (double *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1ae,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (a == d) {
    __assert_fail("a != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1af,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (b == d) {
    __assert_fail("b != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1b0,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (c == d) {
    __assert_fail("c != d",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1b1,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (m < 0) {
    __assert_fail("m >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1b2,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (-1 < n) {
    if (k < 0) {
      __assert_fail("k >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1b4,
                    "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((lda < 1) || (lda < m)) {
      __assert_fail("lda >= 1 && lda >= m",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1b5,
                    "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((ldb < 1) || (ldb < n)) {
      __assert_fail("ldb >= 1 && ldb >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1b6,
                    "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    if ((0 < ldc) && (n <= ldc)) {
      if ((0 < ldd) && (n <= ldd)) {
        if (m != 0) {
          uVar6 = 0;
          do {
            if (n != 0) {
              uVar3 = 0;
              pdVar5 = b;
              do {
                lVar1 = uVar3 + uVar6 * (uint)ldc;
                dVar8 = c[lVar1] * beta;
                pdVar2 = a;
                pdVar4 = pdVar5;
                uVar7 = (ulong)(uint)k;
                if (k != 0) {
                  do {
                    dVar8 = dVar8 + *pdVar2 * alpha * *pdVar4;
                    pdVar4 = pdVar4 + (uint)ldb;
                    pdVar2 = pdVar2 + (uint)lda;
                    uVar7 = uVar7 - 1;
                  } while (uVar7 != 0);
                }
                d[lVar1] = dVar8;
                uVar3 = uVar3 + 1;
                pdVar5 = pdVar5 + 1;
              } while (uVar3 != (uint)n);
            }
            uVar6 = uVar6 + 1;
            a = a + 1;
          } while (uVar6 != (uint)m);
        }
        return;
      }
      __assert_fail("ldd >= 1 && ldd >= n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                    ,0x1b8,
                    "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                   );
    }
    __assert_fail("ldc >= 1 && ldc >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0x1b7,
                  "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0x1b3,
                "void la_dgemm_tnoe(int, int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemm_tnoe(
        int m, int n, int k,
        double alpha,
        const double *a, int lda,
        const double *b, int ldb,
        double beta,
        const double *c, int ldc,
        double *d, int ldd)
{
    assert(a);
    assert(b);
    assert(c);
    assert(a != d);
    assert(b != d);
    assert(c != d);
    assert(m >= 0);
    assert(n >= 0);
    assert(k >= 0);
    assert(lda >= 1 && lda >= m);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);
    assert(ldd >= 1 && ldd >= n);

    for (int i_ = 0; i_ < m; i_++) {
        for (int j_ = 0; j_ < n; j_++) {
            double dij = beta * c[i_ * ldc + j_];
            for (int k_ = 0; k_ < k; k_++) {
                dij += alpha * a[k_ * lda + i_] * b[k_ * ldb + j_];
            }
            d[i_ * ldc + j_] = dij;
        }
    }
}